

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  xmlChar **inclusive_namespaces;
  char *pcVar3;
  int mode;
  char *pcVar4;
  size_t sStack_20;
  
  xmlInitParser();
  xmlCheckVersion(0x33072);
  if (argc < 3) {
    pcVar4 = "Error: wrong number of arguments.\n";
    sStack_20 = 0x22;
LAB_001013eb:
    fwrite(pcVar4,sStack_20,1,_stderr);
    usage(*argv);
    uVar2 = 0xffffffff;
    goto LAB_001013ab;
  }
  pcVar4 = argv[1];
  iVar1 = strcmp(pcVar4,"--with-comments");
  if (iVar1 == 0) {
    pcVar4 = argv[2];
    if (argc == 3) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = argv[3];
    }
    iVar1 = 1;
LAB_0010139f:
    mode = 0;
  }
  else {
    iVar1 = strcmp(pcVar4,"--without-comments");
    if (iVar1 == 0) {
      pcVar4 = argv[2];
      if (argc == 3) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = argv[3];
      }
      iVar1 = 0;
      goto LAB_0010139f;
    }
    iVar1 = strcmp(pcVar4,"--1-1-with-comments");
    if (iVar1 == 0) {
      pcVar4 = argv[2];
      if (argc == 3) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = argv[3];
      }
      iVar1 = 1;
      mode = 2;
    }
    else {
      iVar1 = strcmp(pcVar4,"--1-1-without-comments");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar4,"--exc-with-comments");
        if (iVar1 == 0) {
          if ((uint)argc < 5) {
            pcVar4 = argv[2];
            inclusive_namespaces = (xmlChar **)0x0;
            pcVar3 = (char *)0x0;
            if (argc != 3) goto LAB_00101453;
          }
          else {
            inclusive_namespaces = parse_list((xmlChar *)argv[4]);
            pcVar4 = argv[2];
LAB_00101453:
            pcVar3 = argv[3];
          }
          iVar1 = 1;
        }
        else {
          iVar1 = strcmp(pcVar4,"--exc-without-comments");
          if (iVar1 != 0) {
            pcVar4 = "Error: bad option.\n";
            sStack_20 = 0x13;
            goto LAB_001013eb;
          }
          if ((uint)argc < 5) {
            pcVar4 = argv[2];
            inclusive_namespaces = (xmlChar **)0x0;
            pcVar3 = (char *)0x0;
            if (argc != 3) goto LAB_00101437;
          }
          else {
            inclusive_namespaces = parse_list((xmlChar *)argv[4]);
            pcVar4 = argv[2];
LAB_00101437:
            pcVar3 = argv[3];
          }
          iVar1 = 0;
        }
        uVar2 = test_c14n(pcVar4,iVar1,1,pcVar3,inclusive_namespaces);
        if (inclusive_namespaces != (xmlChar **)0x0) {
          (*_xmlFree)(inclusive_namespaces);
        }
        goto LAB_001013ab;
      }
      pcVar4 = argv[2];
      if (argc == 3) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = argv[3];
      }
      mode = 2;
      iVar1 = 0;
    }
  }
  uVar2 = test_c14n(pcVar4,iVar1,mode,pcVar3,(xmlChar **)0x0);
LAB_001013ab:
  xmlCleanupParser();
  xmlMemoryDump();
  return uVar2 >> 0x1f;
}

Assistant:

int main(int argc, char **argv) {
    int ret = -1;

    /*
     * Init libxml
     */
    xmlInitParser();
    LIBXML_TEST_VERSION

    /*
     * Parse command line and process file
     */
    if( argc < 3 ) {
	fprintf(stderr, "Error: wrong number of arguments.\n");
	usage(argv[0]);
    } else if(strcmp(argv[1], "--with-comments") == 0) {
	ret = test_c14n(argv[2], 1, XML_C14N_1_0, (argc > 3) ? argv[3] : NULL, NULL);
    }